

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

node_t multiplicative_expression(void)

{
  node_t pvVar1;
  char *pcVar2;
  int op;
  node_t right;
  node_t n;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int id;
  int id_00;
  
  pvVar1 = cast_expression();
  if (pvVar1 != (node_t)0x0) {
    while( true ) {
      uVar3 = (undefined3)in_stack_ffffffffffffffe0;
      in_stack_ffffffffffffffe0 = CONCAT13(1,uVar3);
      if ((t->id != 0x2a) && (in_stack_ffffffffffffffe0 = CONCAT13(1,uVar3), t->id != 0x2f)) {
        in_stack_ffffffffffffffe0 = CONCAT13(t->id == 0x25,uVar3);
      }
      if ((char)((uint)in_stack_ffffffffffffffe0 >> 0x18) == '\0') {
        return pvVar1;
      }
      id = t->id;
      next();
      id_00 = (int)((ulong)pvVar1 >> 0x20);
      pvVar1 = cast_expression();
      if (pvVar1 == (node_t)0x0) break;
      pvVar1 = binop(id_00,pvVar1,(node_t)CONCAT44(id,in_stack_ffffffffffffffe0));
    }
    pcVar2 = token_name(id);
    err(E,"expected expression after %s ",pcVar2);
  }
  return (node_t)0x0;
}

Assistant:

node_t multiplicative_expression()
{
    node_t n = NULL;
    if ((n = cast_expression()))
    {
        while (t->id == '*' || t->id == '/' || t->id == '%')
        {
            node_t right = NULL;
            int op = t->id;
            next();
            if (!(right = cast_expression()))
            {
                err(E, "expected expression after %s ", token_name(op));
                return NULL;
            }

            n = binop(op, n, right);
        }
        return n;
    }
    return NULL;
}